

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::fatal<std::__cxx11::string_const&,std::__cxx11::string>
          (ValidationContext *this,IssueFatal *issue,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char *pcVar1;
  FatalValidationError *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  ValidationReport report;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  size_type local_d8;
  char local_d0 [16];
  string local_c0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  _Alloc_hider local_78;
  char local_68 [16];
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_e8[0] = (issue->super_Issue).type;
  local_e8._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_e0._M_p = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_58 = (args->_M_dataplus)._M_p;
  sStack_50 = args->_M_string_length;
  local_48 = (args_1->_M_dataplus)._M_p;
  sStack_40 = args_1->_M_string_length;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_58;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_c0,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_e8);
  this_00 = (FatalValidationError *)__cxa_allocate_exception(0x58);
  local_a0._0_4_ = local_e8._0_4_;
  local_98._M_p = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_e0._M_p,local_e0._M_p + local_d8);
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_c0._M_dataplus._M_p,
             local_c0._M_dataplus._M_p + local_c0._M_string_length);
  FatalValidationError::FatalValidationError(this_00,(ValidationReport *)local_a0);
  __cxa_throw(this_00,&FatalValidationError::typeinfo,FatalValidationError::~FatalValidationError);
}

Assistant:

void fatal(const IssueFatal& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        const auto report = ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)};
        callback(report);

        throw FatalValidationError(report);
    }